

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selector_table.cc
# Opt level: O3

uint sel_copyTypedSelectors_np(char *selName,SEL *sels,uint count)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  SEL poVar4;
  long *plVar5;
  uint uVar6;
  ulong uVar7;
  
  if (selName == (char *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    poVar4 = selector_lookup(selName,(char *)0x0);
    if (poVar4 != (SEL)0x0) {
      uVar1 = *(uint *)&poVar4->field_0;
      pthread_mutex_lock((pthread_mutex_t *)(anonymous_namespace)::selector_table_lock);
      lVar2 = *(anonymous_namespace)::selector_list;
      lVar3 = (anonymous_namespace)::selector_list[1];
      pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::selector_table_lock);
      if (lVar2 != 0 && (ulong)uVar1 < (ulong)(lVar3 - lVar2 >> 3)) {
        plVar5 = *(long **)(lVar2 + (ulong)uVar1 * 8);
        if (count == 0) {
          uVar6 = 0xffffffff;
          do {
            plVar5 = (long *)*plVar5;
            uVar6 = uVar6 + 1;
          } while (plVar5 != (long *)0x0);
        }
        else {
          plVar5 = (long *)*plVar5;
          if (plVar5 != (long *)0x0) {
            uVar7 = 0;
            do {
              poVar4 = selector_lookup(selName,(char *)plVar5[1]);
              uVar6 = (int)uVar7 + 1;
              sels[uVar7] = poVar4;
              plVar5 = (long *)*plVar5;
              if (plVar5 == (long *)0x0) {
                return uVar6;
              }
              uVar7 = (ulong)uVar6;
            } while (uVar6 <= count);
          }
        }
      }
    }
  }
  return uVar6;
}

Assistant:

unsigned sel_copyTypedSelectors_np(const char *selName, SEL *const sels, unsigned count)
{
	if (nullptr == selName) { return 0; }
	SEL untyped = selector_lookup(selName, 0);
	if (untyped == nullptr) { return 0; }

	auto *l = selLookup(untyped->index);
	if (l == nullptr)
	{
		return 0;
	}

	if (count == 0)
	{
		for (auto type : *l)
		{
			count++;
		}
		return count;
	}

	unsigned found = 0;
	for (auto type : *l)
	{
		if (found > count)
		{
			break;
		}
		sels[found++] = selector_lookup(selName, type);
	}
	return found;
}